

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

_Bool mi_count_size_overflow(size_t count,size_t size,size_t *total)

{
  _Bool _Var1;
  size_t *in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  undefined1 local_1;
  
  if (in_RDI == 1) {
    *in_RDX = in_RSI;
    local_1 = false;
  }
  else {
    _Var1 = mi_mul_overflow(in_RDI,in_RSI,in_RDX);
    if (_Var1) {
      *in_RDX = 0xffffffffffffffff;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static inline bool mi_count_size_overflow(size_t count, size_t size, size_t* total) {
  if (count==1) {  // quick check for the case where count is one (common for C++ allocators)
    *total = size;
    return false;
  }
  else if mi_unlikely(mi_mul_overflow(count, size, total)) {
    #if MI_DEBUG > 0
    _mi_error_message(EOVERFLOW, "allocation request is too large (%zu * %zu bytes)\n", count, size);
    #endif
    *total = SIZE_MAX;
    return true;
  }
  else return false;
}